

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatCommon.h
# Opt level: O2

void __thiscall llvm::FmtAlign::format(FmtAlign *this,raw_ostream *S,StringRef Options)

{
  uint32_t Count;
  ulong uVar1;
  SmallString<64U> Item;
  raw_svector_ostream Stream;
  SmallVectorImpl<char> local_b0;
  undefined1 local_a0 [64];
  raw_svector_ostream local_60;
  
  if (this->Amount == 0) {
    (**(code **)(*(long *)this->Adapter + 0x10))(this->Adapter,S,Options.Data,Options.Length);
    return;
  }
  local_b0.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.BeginX = local_a0;
  local_b0.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Size = 0;
  local_b0.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Capacity = 0x40;
  raw_svector_ostream::raw_svector_ostream(&local_60,&local_b0);
  (**(code **)(*(long *)this->Adapter + 0x10))(this->Adapter,&local_60,Options.Data,Options.Length);
  uVar1 = this->Amount -
          (local_b0.super_SmallVectorTemplateBase<char,_true>.
           super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase._8_8_ & 0xffffffff);
  if (this->Amount <
      (local_b0.super_SmallVectorTemplateBase<char,_true>.
       super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase._8_8_ & 0xffffffff) ||
      uVar1 == 0) {
LAB_0015323a:
    raw_ostream::operator<<(S,&local_b0);
  }
  else {
    if (this->Where == Center) {
      Count = (uint32_t)(uVar1 >> 1);
      fill(this,S,Count);
      raw_ostream::operator<<(S,&local_b0);
      uVar1 = (ulong)((uint32_t)uVar1 - Count);
    }
    else {
      if (this->Where != Left) {
        fill(this,S,(uint32_t)uVar1);
        goto LAB_0015323a;
      }
      raw_ostream::operator<<(S,&local_b0);
    }
    fill(this,S,(uint32_t)uVar1);
  }
  raw_ostream::~raw_ostream((raw_ostream *)&local_60);
  SmallVectorImpl<char>::~SmallVectorImpl(&local_b0);
  return;
}

Assistant:

void format(raw_ostream &S, StringRef Options) {
    // If we don't need to align, we can format straight into the underlying
    // stream.  Otherwise we have to go through an intermediate stream first
    // in order to calculate how long the output is so we can align it.
    // TODO: Make the format method return the number of bytes written, that
    // way we can also skip the intermediate stream for left-aligned output.
    if (Amount == 0) {
      Adapter.format(S, Options);
      return;
    }
    SmallString<64> Item;
    raw_svector_ostream Stream(Item);

    Adapter.format(Stream, Options);
    if (Amount <= Item.size()) {
      S << Item;
      return;
    }

    size_t PadAmount = Amount - Item.size();
    switch (Where) {
    case AlignStyle::Left:
      S << Item;
      fill(S, PadAmount);
      break;
    case AlignStyle::Center: {
      size_t X = PadAmount / 2;
      fill(S, X);
      S << Item;
      fill(S, PadAmount - X);
      break;
    }
    default:
      fill(S, PadAmount);
      S << Item;
      break;
    }
  }